

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTPrinter.cc
# Opt level: O2

int __thiscall
flow::lang::ASTPrinter::accept(ASTPrinter *this,int __fd,sockaddr *__addr,socklen_t *__addr_len)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  undefined4 in_register_00000034;
  unique_ptr<flow::lang::Symbol,_std::default_delete<flow::lang::Symbol>_> *symbol;
  undefined8 *puVar3;
  
  printf<char_const*>(this,"Unit: %s\n",*(char **)(CONCAT44(in_register_00000034,__fd) + 0x48));
  this->depth_ = this->depth_ + 1;
  puVar2 = *(undefined8 **)(CONCAT44(in_register_00000034,__fd) + 0x70);
  puVar1 = (undefined8 *)puVar2[1];
  for (puVar3 = (undefined8 *)*puVar2; puVar3 != puVar1; puVar3 = puVar3 + 1) {
    puVar2 = (undefined8 *)(**(code **)(*(long *)*puVar3 + 0x10))((long *)*puVar3,this);
  }
  this->depth_ = this->depth_ + -1;
  return (int)puVar2;
}

Assistant:

void ASTPrinter::accept(UnitSym& unit) {
  printf("Unit: %s\n", unit.name().c_str());

  enter();
  for (std::unique_ptr<Symbol>& symbol : *unit.scope())
    symbol->visit(*this);

  leave();
}